

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dired.c
# Opt level: O0

int d_findfile(int f,int n)

{
  int iVar1;
  char local_428 [8];
  char fname [1024];
  buffer *pbStack_20;
  int s;
  buffer *bp;
  int n_local;
  int f_local;
  
  fname._1020_4_ = d_makename(curwp->w_dotp,local_428,0x400);
  if (fname._1020_4_ == 2) {
    n_local = 0;
  }
  else {
    if (fname._1020_4_ == 1) {
      pbStack_20 = dired_(local_428);
    }
    else {
      pbStack_20 = findbuffer(local_428);
    }
    if (pbStack_20 == (buffer *)0x0) {
      n_local = 0;
    }
    else {
      curbp = pbStack_20;
      iVar1 = showbuffer(pbStack_20,curwp,8);
      if (iVar1 == 1) {
        if (pbStack_20->b_fname[0] == '\0') {
          n_local = readin(local_428);
        }
        else {
          n_local = 1;
        }
      }
      else {
        n_local = 0;
      }
    }
  }
  return n_local;
}

Assistant:

int
d_findfile(int f, int n)
{
	struct buffer	*bp;
	int		 s;
	char		 fname[NFILEN];

	if ((s = d_makename(curwp->w_dotp, fname, sizeof(fname))) == ABORT)
		return (FALSE);
	if (s == TRUE)
		bp = dired_(fname);
	else
		bp = findbuffer(fname);
	if (bp == NULL)
		return (FALSE);
	curbp = bp;
	if (showbuffer(bp, curwp, WFFULL) != TRUE)
		return (FALSE);
	if (bp->b_fname[0] != 0)
		return (TRUE);
	return (readin(fname));
}